

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_crc.h
# Opt level: O2

CordRep * absl::lts_20250127::cord_internal::RemoveCrcNode(CordRep *rep)

{
  CordRep *rep_00;
  CordRepCrc *pCVar1;
  
  if (rep == (CordRep *)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                  ,0x37,"CordRep *absl::cord_internal::RemoveCrcNode(CordRep *)");
  }
  if (rep->tag == '\x02') {
    pCVar1 = CordRep::crc(rep);
    rep_00 = pCVar1->child;
    if ((rep->refcount).count_.super___atomic_base<int>._M_i == 2) {
      pCVar1 = CordRep::crc(rep);
      if (pCVar1 != (CordRepCrc *)0x0) {
        crc_internal::CrcCordState::~CrcCordState(&pCVar1->crc_cord_state);
      }
      operator_delete(pCVar1,0x20);
      rep = rep_00;
    }
    else {
      CordRep::Ref(rep_00);
      CordRep::Unref(rep);
      rep = rep_00;
    }
  }
  return rep;
}

Assistant:

inline CordRep* RemoveCrcNode(CordRep* rep) {
  assert(rep != nullptr);
  if (ABSL_PREDICT_FALSE(rep->IsCrc())) {
    CordRep* child = rep->crc()->child;
    if (rep->refcount.IsOne()) {
      delete rep->crc();
    } else {
      CordRep::Ref(child);
      CordRep::Unref(rep);
    }
    return child;
  }
  return rep;
}